

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTetrahedronShape.cpp
# Opt level: O2

void __thiscall
btBU_Simplex1to4::btBU_Simplex1to4(btBU_Simplex1to4 *this,btVector3 *pt0,btVector3 *pt1)

{
  btPolyhedralConvexAabbCachingShape::btPolyhedralConvexAabbCachingShape
            (&this->super_btPolyhedralConvexAabbCachingShape);
  (this->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
  super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape =
       (_func_int **)&PTR__btPolyhedralConvexShape_001efb98;
  *(undefined4 *)&(this->super_btPolyhedralConvexAabbCachingShape).field_0x74 = 0;
  (this->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
  super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.m_shapeType = 2;
  addVertex(this,pt0);
  addVertex(this,pt1);
  return;
}

Assistant:

btBU_Simplex1to4::btBU_Simplex1to4(const btVector3& pt0,const btVector3& pt1) : btPolyhedralConvexAabbCachingShape (),
m_numVertices(0)
{
	m_shapeType = TETRAHEDRAL_SHAPE_PROXYTYPE;
	addVertex(pt0);
	addVertex(pt1);
}